

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::TransformFeedbackCase
          (TransformFeedbackCase *this,Context *context,char *name,char *desc,deUint32 bufferMode,
          deUint32 primitiveType)

{
  deUint32 primitiveType_local;
  deUint32 bufferMode_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TransformFeedbackCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_0329f5a0;
  ProgramSpec::ProgramSpec(&this->m_progSpec);
  this->m_bufferMode = bufferMode;
  this->m_primitiveType = primitiveType;
  this->m_inputStride = 0;
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ::vector(&this->m_attributes);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ::vector(&this->m_transformFeedbackOutputs);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_bufferStrides);
  this->m_program = (ShaderProgram *)0x0;
  this->m_transformFeedback = (TransformFeedback *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_outputBuffers);
  this->m_iterNdx = 0;
  return;
}

Assistant:

TransformFeedbackCase::TransformFeedbackCase (Context& context, const char* name, const char* desc, deUint32 bufferMode, deUint32 primitiveType)
	: TestCase				(context, name, desc)
	, m_bufferMode			(bufferMode)
	, m_primitiveType		(primitiveType)
	, m_inputStride			(0)
	, m_program				(DE_NULL)
	, m_transformFeedback	(DE_NULL)
	, m_iterNdx				(0)
{
}